

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

size_t singleOptionUsage(FILE *fp,columns_t columns,poptOption *opt,char *translation_domain)

{
  char *s;
  ushort **ppuVar1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  int __c;
  bool bVar7;
  int prtshort;
  char *argDescrip;
  size_t len;
  char *translation_domain_local;
  poptOption *opt_local;
  columns_t columns_local;
  FILE *fp_local;
  
  s = getArgDescrip(opt,translation_domain);
  ppuVar1 = __ctype_b_loc();
  bVar7 = false;
  if (((*ppuVar1)[(int)opt->shortName] & 0x4000) != 0) {
    bVar7 = opt->shortName != ' ';
  }
  if ((bVar7) || (opt->longName != (char *)0x0)) {
    argDescrip = (char *)0x3;
    if (bVar7) {
      argDescrip = (char *)0x5;
    }
    if (opt->longName != (char *)0x0) {
      if (bVar7) {
        argDescrip = argDescrip + 1;
      }
      lVar2 = 3;
      if ((opt->argInfo & 0x80000000) != 0) {
        lVar2 = 2;
      }
      sVar3 = strlen(opt->longName);
      argDescrip = argDescrip + sVar3 + lVar2 + -1;
    }
    if (s != (char *)0x0) {
      pcVar4 = strchr(" =(",(int)*s);
      if (pcVar4 == (char *)0x0) {
        argDescrip = argDescrip + 1;
      }
      sVar5 = stringDisplayWidth(s);
      argDescrip = argDescrip + sVar5;
    }
    if ((char *)columns->max < argDescrip + columns->cur) {
      fprintf((FILE *)fp,"\n       ");
      columns->cur = 7;
    }
    fprintf((FILE *)fp," [");
    if (bVar7) {
      fprintf((FILE *)fp,"-%c",(ulong)(uint)(int)opt->shortName);
    }
    if (opt->longName != (char *)0x0) {
      pcVar4 = "";
      if (bVar7) {
        pcVar4 = "|";
      }
      pcVar6 = "--";
      if ((opt->argInfo & 0x80000000) != 0) {
        pcVar6 = "-";
      }
      fprintf((FILE *)fp,"%s%s%s",pcVar4,pcVar6,opt->longName);
    }
    if (s != (char *)0x0) {
      pcVar4 = strchr(" =(",(int)*s);
      if (pcVar4 == (char *)0x0) {
        __c = 0x3d;
        if (opt->longName == (char *)0x0) {
          __c = 0x20;
        }
        fputc(__c,(FILE *)fp);
      }
      fprintf((FILE *)fp,"%s",s);
    }
    fprintf((FILE *)fp,"]");
    fp_local = (FILE *)(argDescrip + columns->cur + 1);
  }
  else {
    fp_local = (FILE *)columns->cur;
  }
  return (size_t)fp_local;
}

Assistant:

static size_t singleOptionUsage(FILE * fp, columns_t columns,
		const struct poptOption * opt,
		const char *translation_domain)
{
    size_t len = sizeof(" []")-1;
    const char * argDescrip = getArgDescrip(opt, translation_domain);
    /* Display shortName iff printable non-space. */
    int prtshort = (int)(isprint((int)opt->shortName) && opt->shortName != ' ');

#define	prtlong	(opt->longName != NULL)	/* XXX splint needs a clue */
    if (!(prtshort || prtlong))
	return columns->cur;

    len = sizeof(" []")-1;
    if (prtshort)
	len += sizeof("-c")-1;
    if (prtlong) {
	if (prtshort) len += sizeof("|")-1;
	len += (F_ISSET(opt, ONEDASH) ? sizeof("-") : sizeof("--")) - 1;
	len += strlen(opt->longName);
    }

    if (argDescrip) {

	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) len += sizeof("=")-1;

	/* Adjust for (possible) wide characters. */
	len += stringDisplayWidth(argDescrip);
    }

    if ((columns->cur + len) > columns->max) {
	fprintf(fp, "\n       ");
	columns->cur = (size_t)7;
    } 

    fprintf(fp, " [");
    if (prtshort)
	fprintf(fp, "-%c", opt->shortName);
    if (prtlong)
	fprintf(fp, "%s%s%s",
		(prtshort ? "|" : ""),
		(F_ISSET(opt, ONEDASH) ? "-" : "--"),
		opt->longName);
#undef	prtlong

    if (argDescrip) {
	/* XXX argDescrip[0] determines "--foo=bar" or "--foo bar". */
	if (!strchr(" =(", argDescrip[0])) fputc(opt->longName == NULL ? ' ' : '=', fp);
	fprintf(fp, "%s", argDescrip);
    }
    fprintf(fp, "]");

    return columns->cur + len + 1;
}